

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,AccessChainFlags flags,AccessChainMeta *meta)

{
  BuiltIn BVar1;
  Variant *pVVar2;
  size_t sVar3;
  pointer pcVar4;
  undefined1 *puVar5;
  ID id;
  char cVar6;
  bool bVar7;
  char cVar8;
  uint32_t uVar9;
  int iVar10;
  ExecutionModel EVar11;
  SPIRType *pSVar12;
  long lVar13;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  string *psVar14;
  char *pcVar15;
  undefined7 extraout_var_01;
  SPIRVariable *pSVar16;
  mapped_type *pmVar17;
  SPIRConstant *pSVar18;
  runtime_error *prVar19;
  uint uVar20;
  undefined8 uVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint uVar22;
  SPIRType *type;
  uint id_00;
  ulong uVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  CompilerGLSL *pCVar25;
  TypedID<(spirv_cross::Types)0> *pTVar26;
  undefined4 uVar27;
  undefined4 in_register_00000084;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar28;
  undefined4 in_register_0000008c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3;
  ulong uVar29;
  SPIRExpression *unaff_R14;
  undefined7 uVar30;
  TypedID<(spirv_cross::Types)0> *pTVar31;
  bool is_packed;
  bool access_chain_is_arrayed;
  string qual_mbr_name;
  BuiltIn builtin;
  bool local_10a;
  undefined1 local_109 [17];
  undefined1 local_f8 [52];
  ID local_c4;
  uint local_c0;
  uint local_bc;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  SPIRExpression *local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  TypedID<(spirv_cross::Types)0> *local_40;
  uint32_t *local_38;
  
  ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(in_register_0000008c,flags);
  pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(in_register_00000084,count);
  local_109._1_8_ = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_109._1_8_;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_50._M_allocated_capacity = (size_type)base;
  local_109._13_4_ = flags;
  local_c4.id = base;
  local_38 = indices;
  if ((flags & 2) == 0) {
    if ((local_50._M_allocated_capacity <
         (SPIRType *)
         (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar2[local_50._M_allocated_capacity].type == TypeExpression)) {
      unaff_R14 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + local_50._M_allocated_capacity)
      ;
    }
    else {
      unaff_R14 = (SPIRExpression *)0x0;
    }
    if (unaff_R14 == (SPIRExpression *)0x0) {
      bVar7 = false;
    }
    else {
      bVar7 = unaff_R14->need_transpose;
      unaff_R14->need_transpose = false;
    }
    to_enclosed_expression_abi_cxx11_
              ((string *)local_f8,this,local_c4.id,(local_109._13_4_ & 8) == 0);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_f8);
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_);
    }
    if (unaff_R14 != (SPIRExpression *)0x0) {
      unaff_R14->need_transpose = bVar7;
    }
  }
  uVar9 = Compiler::expression_type_id(&this->super_Compiler,local_c4.id);
  uVar29 = (ulong)uVar9;
  if ((this->backend).native_pointers == false) {
    if ((local_109._13_4_ & 4) != 0) {
      prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_f8._0_8_ = local_f8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,
                 "Backend does not support native pointers and does not support OpPtrAccessChain.",
                 "");
      ::std::runtime_error::runtime_error(prVar19,(string *)local_f8);
      *(undefined ***)prVar19 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar7 = should_dereference(this,local_c4.id);
    if (bVar7) {
      pSVar12 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + uVar29);
      dereference_expression((string *)local_f8,this,pSVar12,__return_storage_ptr__);
      unaff_R14 = (SPIRExpression *)local_f8;
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)unaff_R14);
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_);
      }
    }
  }
  local_f8._40_8_ = Compiler::get_pointee_type(&this->super_Compiler,uVar9);
  lVar13 = ::std::__cxx11::string::find((char)__return_storage_ptr__,0x5b);
  id.id = local_c4.id;
  local_109[0] = lVar13 != -1;
  local_bc = (*(this->super_Compiler)._vptr_Compiler[0x27])(this,(ulong)local_c4.id);
  local_10a = Compiler::has_extended_decoration
                        (&this->super_Compiler,id.id,SPIRVCrossDecorationPhysicalTypePacked);
  local_f8._36_4_ =
       Compiler::get_extended_decoration
                 (&this->super_Compiler,id.id,SPIRVCrossDecorationPhysicalTypeID);
  bVar7 = Compiler::has_decoration(&this->super_Compiler,id,DecorationInvariant);
  local_98._M_allocated_capacity._4_4_ = (undefined4)CONCAT71(extraout_var,bVar7);
  bVar7 = Compiler::has_decoration(&this->super_Compiler,id,DecorationRelaxedPrecision);
  local_98._M_allocated_capacity._0_4_ = (undefined4)CONCAT71(extraout_var_00,bVar7);
  if (count == 0) {
    uVar20 = 0;
  }
  else {
    local_74 = local_109._13_4_ & 0x11;
    local_50._8_8_ = &(this->super_Compiler).ir.meta;
    local_98._8_4_ = local_109._13_4_ & 0xfffffffa;
    local_78 = local_109._13_4_ & 0xfffffffe;
    pTVar31 = (TypedID<(spirv_cross::Types)0> *)0x0;
    local_c0 = 0;
    local_88 = (SPIRExpression *)0x0;
    local_40 = (TypedID<(spirv_cross::Types)0> *)(ulong)count;
    do {
      uVar20 = local_38[(long)pTVar31];
      uVar9 = local_109._13_4_ & 0xff;
      uVar22 = 0;
      if (-1 < (int)uVar20) {
        uVar22 = uVar9;
      }
      id_00 = uVar20 & 0x7fffffff;
      if (local_74 != 0x11) {
        id_00 = uVar20;
      }
      uVar23 = (ulong)id_00;
      if (local_74 != 0x11) {
        uVar22 = uVar9;
      }
      bVar7 = pTVar31 != (TypedID<(spirv_cross::Types)0> *)0x0 || (local_109._13_4_ & 4) == 0;
      pSVar12 = (SPIRType *)(ulong)CONCAT31((int3)(uVar20 >> 8),bVar7);
      uVar30 = (undefined7)((ulong)unaff_R14 >> 8);
      if (bVar7) {
        sVar3 = *(size_t *)(local_f8._40_8_ + 0x28);
        if (sVar3 != 0) {
          uVar20 = local_c0;
          if (((this->options).flatten_multidimensional_arrays == true) && ((local_c0 & 1) == 0)) {
            unaff_R14 = (SPIRExpression *)CONCAT71(uVar30,sVar3 != 1);
            uVar20 = (uint)unaff_R14;
            local_88 = unaff_R14;
            if (sVar3 != 1) {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
          }
          local_c0 = uVar20;
          if (((TypeID *)(local_f8._40_8_ + 0x114))->id == 0) {
            __assert_fail("type->parent_type",
                          "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                          ,0x23c9,
                          "string spirv_cross::CompilerGLSL::access_chain_internal(uint32_t, const uint32_t *, uint32_t, AccessChainFlags, AccessChainMeta *)"
                         );
          }
          uVar21 = local_50._M_allocated_capacity;
          if ((ulong)local_50._0_8_ <
              (SPIRType *)
              (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) {
            pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
            uVar21 = local_50._M_allocated_capacity * 3;
            if (pVVar2[local_50._M_allocated_capacity].type != TypeVariable) goto LAB_001e9144;
            pSVar16 = Variant::get<spirv_cross::SPIRVariable>
                                (pVVar2 + local_50._M_allocated_capacity);
          }
          else {
LAB_001e9144:
            pSVar16 = (SPIRVariable *)0x0;
          }
          if ((((pTVar31 != (TypedID<(spirv_cross::Types)0> *)0x0) ||
               (pSVar16 == (SPIRVariable *)0x0)) || ((this->backend).force_gl_in_out_block == false)
              ) || ((bVar7 = Compiler::is_builtin_variable(&this->super_Compiler,pSVar16), !bVar7 ||
                    (bVar7 = Compiler::has_decoration
                                       (&this->super_Compiler,(ID)((ID *)(local_f8._40_8_ + 8))->id,
                                        DecorationBlock), bVar7)))) {
            if (((this->options).flatten_multidimensional_arrays == true) &&
               (((ulong)local_88 & 1) != 0)) {
              pSVar12 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_Compiler).ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   ((TypeID *)(local_f8._40_8_ + 0x114))->id);
              if ((uVar22 & 1) == 0) {
                to_enclosed_expression_abi_cxx11_
                          ((string *)local_f8,this,id_00,(local_109._13_4_ & 8) == 0);
                ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_f8._0_8_);
              }
              else {
                cVar8 = '\x01';
                if (9 < id_00) {
                  cVar6 = '\x04';
                  do {
                    cVar8 = cVar6;
                    uVar20 = (uint)uVar23;
                    if (uVar20 < 100) {
                      cVar8 = cVar8 + -2;
                      goto LAB_001e9a00;
                    }
                    if (uVar20 < 1000) {
                      cVar8 = cVar8 + -1;
                      goto LAB_001e9a00;
                    }
                    if (uVar20 < 10000) goto LAB_001e9a00;
                    uVar23 = uVar23 / 10000;
                    cVar6 = cVar8 + '\x04';
                  } while (99999 < uVar20);
                  cVar8 = cVar8 + '\x01';
                }
LAB_001e9a00:
                local_f8._0_8_ = local_f8 + 0x10;
                ::std::__cxx11::string::_M_construct((ulong)local_f8,cVar8);
                ::std::__detail::__to_chars_10_impl<unsigned_int>
                          ((char *)local_f8._0_8_,local_f8._8_4_,id_00);
                ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_f8._0_8_);
              }
              if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
                operator_delete((void *)local_f8._0_8_);
              }
              uVar9 = (uint32_t)(pSVar12->array).super_VectorView<unsigned_int>.buffer_size;
              while (uVar9 != 0) {
                uVar9 = uVar9 - 1;
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                pCVar25 = this;
                to_array_size_abi_cxx11_((string *)local_b8,this,pSVar12,uVar9);
                enclose_expression((string *)local_f8,pCVar25,(string *)local_b8);
                ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_f8._0_8_);
                if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
                  operator_delete((void *)local_f8._0_8_);
                }
                if ((TypedID<(spirv_cross::Types)0> *)local_b8._0_8_ !=
                    (TypedID<(spirv_cross::Types)0> *)(local_b8 + 0x10)) {
                  operator_delete((void *)local_b8._0_8_);
                }
              }
              if ((pSVar12->array).super_VectorView<unsigned_int>.buffer_size == 0) {
                local_c0 = 0;
              }
              else {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              if ((local_c0 & 1) == 0) {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
            }
            else {
              uVar9 = Compiler::get_decoration(&this->super_Compiler,local_c4,DecorationBuiltIn);
              pSVar12 = (SPIRType *)(this->super_Compiler)._vptr_Compiler;
              cVar8 = (*(code *)(pSVar12->member_name_cache)._M_h._M_bucket_count)(this,uVar9);
              if (cVar8 == '\0') {
                uVar27 = local_98._8_4_;
                if ((uVar22 & 1) != 0) {
                  uVar27 = local_109._13_4_;
                }
                pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (ulong)(uVar27 & 0xfffffffb);
                ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_109;
                access_chain_internal_append_index
                          (this,__return_storage_ptr__,extraout_EDX_00,pSVar12,uVar27 & 0xfffffffb,
                           (bool *)ts_3,id_00);
                (*(this->super_Compiler)._vptr_Compiler[0x2c])
                          (this,__return_storage_ptr__,local_f8._40_8_,(ulong)(uint)local_f8._36_4_)
                ;
              }
            }
          }
          else {
            local_f8._0_4_ = local_c4.id;
            pmVar17 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_50._8_8_,(key_type *)local_f8);
            BVar1 = (pmVar17->decoration).builtin_type;
            unaff_R14 = (SPIRExpression *)(ulong)BVar1;
            EVar11 = Compiler::get_execution_model(&this->super_Compiler);
            pbVar28 = __return_storage_ptr__;
            if (BVar1 < BuiltInTessLevelOuter) {
              uVar21 = (SPIRType *)0x680;
              if ((0x680U >> (BVar1 & BuiltInGlobalSize) & 1) != 0) goto LAB_001e9424;
              uVar21 = (SPIRType *)0x3;
              if ((3U >> (BVar1 & BuiltInGlobalSize) & 1) == 0) goto LAB_001e940e;
              if (EVar11 == ExecutionModelMeshEXT) {
                to_expression_abi_cxx11_((string *)local_b8,this,id_00,(local_109._13_4_ & 8) == 0);
                join<char_const(&)[20],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                          ((string *)local_f8,(spirv_cross *)"gl_MeshVerticesEXT[",
                           (char (*) [20])local_b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x348734,(char (*) [3])__return_storage_ptr__,ts_3);
              }
              else if (pSVar16->storage == StorageClassOutput) {
                to_expression_abi_cxx11_((string *)local_b8,this,id_00,(local_109._13_4_ & 8) == 0);
                join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                          ((string *)local_f8,(spirv_cross *)"gl_out[",(char (*) [8])local_b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x348734,(char (*) [3])__return_storage_ptr__,ts_3);
              }
              else {
                if (pSVar16->storage != StorageClassInput) goto LAB_001e99af;
                to_expression_abi_cxx11_((string *)local_b8,this,id_00,(local_109._13_4_ & 8) == 0);
                join<char_const(&)[7],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                          ((string *)local_f8,(spirv_cross *)"gl_in[",(char (*) [7])local_b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x348734,(char (*) [3])__return_storage_ptr__,ts_3);
              }
LAB_001e9471:
              unaff_R14 = (SPIRExpression *)local_f8;
              ::std::__cxx11::string::operator=
                        ((string *)__return_storage_ptr__,(string *)unaff_R14);
              if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
                operator_delete((void *)local_f8._0_8_);
              }
              if ((TypedID<(spirv_cross::Types)0> *)local_b8._0_8_ !=
                  (TypedID<(spirv_cross::Types)0> *)(local_b8 + 0x10)) {
                operator_delete((void *)local_b8._0_8_);
              }
            }
            else {
LAB_001e940e:
              if ((BVar1 == BuiltInPrimitiveShadingRateKHR) || (BVar1 == BuiltInCullPrimitiveEXT)) {
LAB_001e9424:
                if (EVar11 == ExecutionModelMeshEXT) {
                  to_expression_abi_cxx11_
                            ((string *)local_b8,this,id_00,(local_109._13_4_ & 8) == 0);
                  join<char_const(&)[22],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                            ((string *)local_f8,(spirv_cross *)"gl_MeshPrimitivesEXT[",
                             (char (*) [22])local_b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x348734,(char (*) [3])__return_storage_ptr__,ts_3);
                  goto LAB_001e9471;
                }
              }
LAB_001e99af:
              uVar27 = local_98._8_4_;
              if ((uVar22 & 1) != 0) {
                uVar27 = local_109._13_4_;
              }
              pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (ulong)(uVar27 & 0xfffffffb);
              ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_109;
              access_chain_internal_append_index
                        (this,__return_storage_ptr__,extraout_EDX_01,(SPIRType *)uVar21,
                         uVar27 & 0xfffffffb,(bool *)ts_3,id_00);
              (*(this->super_Compiler)._vptr_Compiler[0x2c])
                        (this,__return_storage_ptr__,local_f8._40_8_,(ulong)(uint)local_f8._36_4_);
            }
          }
          uVar29 = (ulong)((TypeID *)(local_f8._40_8_ + 0x114))->id;
          local_f8._40_8_ =
               Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          uVar29);
          goto LAB_001e9b35;
        }
        if (*(int *)(local_f8._40_8_ + 0xc) == 0xf) {
          if ((uVar22 & 1) == 0) {
            uVar9 = Compiler::evaluate_constant_u32(&this->super_Compiler,id_00);
            uVar23 = (ulong)uVar9;
          }
          uVar21 = local_f8._40_8_;
          uVar20 = (uint)uVar23;
          if (uVar20 < *(uint *)(local_f8._40_8_ + 200)) {
            uVar20 = (((SmallVector<unsigned_int,_8UL> *)(local_f8._40_8_ + 0xc0))->
                     super_VectorView<unsigned_int>).ptr[uVar23];
          }
          pbVar24 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)uVar20;
          if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               (local_f8._40_8_ + 0x90) <= pbVar24) {
            prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_f8._0_8_ = local_f8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f8,"Member index is out of bounds!","");
            ::std::runtime_error::runtime_error(prVar19,(string *)local_f8);
            *(undefined ***)prVar19 = &PTR__runtime_error_003d7e38;
            __cxa_throw(prVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar7 = Compiler::is_member_builtin
                            (&this->super_Compiler,(SPIRType *)local_f8._40_8_,uVar20,
                             (BuiltIn *)(local_98._M_local_buf + 0xc));
          if ((bVar7) &&
             (iVar10 = (*(this->super_Compiler)._vptr_Compiler[0x2b])(this,(ulong)local_c4.id),
             (char)iVar10 != '\0')) {
            if (local_109[0] == '\x01') {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              (*(this->super_Compiler)._vptr_Compiler[0x14])
                        (local_f8,this,(ulong)(uint)local_98._12_4_,
                         (ulong)*(StorageClass *)(uVar21 + 0x80));
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_f8._0_8_);
            }
            else {
              unaff_R14 = (SPIRExpression *)local_f8;
              (*(this->super_Compiler)._vptr_Compiler[0x14])
                        (unaff_R14,this,(ulong)(uint)local_98._12_4_,
                         (ulong)*(StorageClass *)(uVar21 + 0x80));
              ::std::__cxx11::string::operator=
                        ((string *)__return_storage_ptr__,(string *)unaff_R14);
            }
          }
          else {
            psVar14 = Compiler::get_member_qualified_name_abi_cxx11_
                                (&this->super_Compiler,(TypeID)(uint32_t)uVar29,uVar20);
            local_f8._0_8_ = local_f8 + 0x10;
            pcVar4 = (psVar14->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_f8,pcVar4,pcVar4 + psVar14->_M_string_length);
            if (local_f8._8_8_ == 0) {
              ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (ulong)(uint)local_109._13_4_;
              if ((local_109._13_4_ & 0x20) == 0) {
                ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (ulong)((local_109._13_4_ & 4) >> 2);
                pbVar28 = pbVar24;
                (*(this->super_Compiler)._vptr_Compiler[0x2e])
                          (local_b8,this,(ulong)local_c4.id,uVar21);
                ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_b8._0_8_);
                puVar5 = local_b8;
                pTVar26 = (TypedID<(spirv_cross::Types)0> *)local_b8._0_8_;
              }
              else {
                unaff_R14 = (SPIRExpression *)local_70;
                ts_1 = pbVar24;
                to_member_name_abi_cxx11_((string *)unaff_R14,this,(SPIRType *)uVar21,uVar20);
                join<char_const(&)[2],std::__cxx11::string>
                          ((string *)local_b8,(spirv_cross *)0x34c680,(char (*) [2])unaff_R14,ts_1);
                ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_b8._0_8_);
                if ((TypedID<(spirv_cross::Types)0> *)local_b8._0_8_ !=
                    (TypedID<(spirv_cross::Types)0> *)(local_b8 + 0x10)) {
                  operator_delete((void *)local_b8._0_8_);
                }
                puVar5 = local_70;
                pTVar26 = (TypedID<(spirv_cross::Types)0> *)local_70._0_8_;
              }
              if (pTVar26 != (TypedID<(spirv_cross::Types)0> *)(puVar5 + 0x10)) {
                operator_delete(pTVar26);
              }
            }
            else {
              ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            }
          }
          if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
            operator_delete((void *)local_f8._0_8_);
          }
          bVar7 = Compiler::has_member_decoration
                            (&this->super_Compiler,(TypeID)((ID *)(uVar21 + 8))->id,uVar20,
                             DecorationInvariant);
          local_98._M_allocated_capacity._4_4_ = local_98._M_allocated_capacity._4_4_ & 0xff;
          if (bVar7) {
            local_98._M_allocated_capacity._4_4_ = 1;
          }
          bVar7 = Compiler::has_member_decoration
                            (&this->super_Compiler,(TypeID)((ID *)(uVar21 + 8))->id,uVar20,
                             DecorationRelaxedPrecision);
          local_98._M_allocated_capacity._0_4_ = local_98._M_allocated_capacity._0_4_ & 0xff;
          if (bVar7) {
            local_98._M_allocated_capacity._0_4_ = 1;
          }
          local_10a = Compiler::has_extended_member_decoration
                                (&this->super_Compiler,((ID *)(uVar21 + 8))->id,uVar20,
                                 SPIRVCrossDecorationPhysicalTypePacked);
          bVar7 = Compiler::has_extended_member_decoration
                            (&this->super_Compiler,((ID *)(uVar21 + 8))->id,uVar20,
                             SPIRVCrossDecorationPhysicalTypeID);
          local_f8._36_4_ = 0;
          if (bVar7) {
            local_f8._36_4_ =
                 Compiler::get_extended_member_decoration
                           (&this->super_Compiler,((ID *)(uVar21 + 8))->id,uVar20,
                            SPIRVCrossDecorationPhysicalTypeID);
          }
          local_bc = (*(this->super_Compiler)._vptr_Compiler[0x28])(this,uVar21,pbVar24);
          local_f8._40_8_ =
               Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                           (uVar21 + 0x88))->
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr
                          [(long)pbVar24].id);
        }
        else if (*(uint32_t *)(local_f8._40_8_ + 0x18) < 2) {
          if (*(uint32_t *)(local_f8._40_8_ + 0x14) < 2) {
            if ((this->backend).allow_truncated_access_chain == false) {
              prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_f8._0_8_ = local_f8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_f8,"Cannot subdivide a scalar value!","");
              ::std::runtime_error::runtime_error(prVar19,(string *)local_f8);
              *(undefined ***)prVar19 = &PTR__runtime_error_003d7e38;
              __cxa_throw(prVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          else {
            pcVar15 = local_f8 + 0x10;
            local_f8._8_8_ = 0;
            local_f8[0x10] = '\0';
            local_f8._0_8_ = pcVar15;
            if (((local_bc & 1) != 0) &&
               (pcVar15 = (char *)::std::__cxx11::string::rfind((char)__return_storage_ptr__,0x5b),
               pcVar15 != (char *)0xffffffffffffffff)) {
              unaff_R14 = (SPIRExpression *)local_b8;
              ::std::__cxx11::string::substr((ulong)unaff_R14,(ulong)__return_storage_ptr__);
              ::std::__cxx11::string::operator=((string *)local_f8,(string *)unaff_R14);
              if ((TypedID<(spirv_cross::Types)0> *)local_b8._0_8_ !=
                  (TypedID<(spirv_cross::Types)0> *)(local_b8 + 0x10)) {
                operator_delete((void *)local_b8._0_8_);
              }
              pcVar15 = (char *)::std::__cxx11::string::resize
                                          ((ulong)__return_storage_ptr__,(char)pcVar15);
            }
            if ((local_109._13_4_ & 0x40) == 0) {
              pSVar12 = Compiler::expression_type(&this->super_Compiler,local_c4.id);
              local_f8._36_4_ = StorageClassGeneric;
              if (pSVar12->pointer == true) {
                local_f8._36_4_ = get_expression_effective_storage_class(this,local_c4.id);
              }
              pSVar16 = Compiler::maybe_get_backing_variable(&this->super_Compiler,local_c4.id);
              if (((pSVar16 == (SPIRVariable *)0x0) || (pSVar16->storage != StorageClassOutput)) ||
                 (EVar11 = Compiler::get_execution_model(&this->super_Compiler),
                 EVar11 != ExecutionModelTessellationControl)) {
                local_7c = 0;
              }
              else {
                bVar7 = Compiler::has_decoration
                                  (&this->super_Compiler,(ID)(pSVar16->super_IVariant).self.id,
                                   DecorationPatch);
                local_7c = (uint)CONCAT71(extraout_var_01,bVar7) ^ 1;
              }
            }
            else {
              local_7c = (uint)CONCAT71((int7)((ulong)pcVar15 >> 8),1);
              local_f8._36_4_ = StorageClassGeneric;
            }
            if (((char)local_7c == '\0') && ((local_bc & 1) == 0)) {
              pSVar12 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_Compiler).ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   ((TypeID *)(local_f8._40_8_ + 0x114))->id);
              ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (this->super_Compiler)._vptr_Compiler;
              pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_10a;
              (*(code *)ts_3[0xb]._M_string_length)
                        (this,__return_storage_ptr__,pSVar12,local_f8._36_4_);
            }
            if ((uVar22 & 1) == 0) {
              pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
              if ((pVVar2[uVar23].type == TypeConstant) && (((local_10a | (byte)local_bc) & 1) == 0)
                 ) {
                pSVar18 = Variant::get<spirv_cross::SPIRConstant>(pVVar2 + uVar23);
                unaff_R14 = (SPIRExpression *)(ulong)*(uint32_t *)(local_f8._40_8_ + 0x14);
                if (pSVar18->specialization == true) {
                  if ((pSVar18->m).c[0].r[0].u32 < *(uint32_t *)(local_f8._40_8_ + 0x14)) {
                    to_expression_abi_cxx11_((string *)local_70,this,id_00,true);
                  }
                  else {
                    local_70._0_8_ = local_70 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"0","");
                  }
                  join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                            ((string *)local_b8,(spirv_cross *)0x3464bc,(char (*) [2])local_70,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x33ea72,(char (*) [2])pbVar28);
                  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_b8._0_8_);
                  if ((TypedID<(spirv_cross::Types)0> *)local_b8._0_8_ !=
                      (TypedID<(spirv_cross::Types)0> *)(local_b8 + 0x10)) {
                    operator_delete((void *)local_b8._0_8_);
                  }
                  puVar5 = local_70;
                  pTVar26 = (TypedID<(spirv_cross::Types)0> *)local_70._0_8_;
                  goto LAB_001e9cfc;
                }
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              else {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                to_unpacked_expression_abi_cxx11_
                          ((string *)local_b8,this,id_00,(local_109._13_4_ & 8) == 0);
                ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_b8._0_8_);
                if ((TypedID<(spirv_cross::Types)0> *)local_b8._0_8_ !=
                    (TypedID<(spirv_cross::Types)0> *)(local_b8 + 0x10)) {
                  operator_delete((void *)local_b8._0_8_);
                }
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
            }
            else if (((local_10a | (byte)local_bc) & 1) == 0) {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            else {
              if (*(uint32_t *)(local_f8._40_8_ + 0x14) <= id_00) {
                id_00 = 0;
              }
              local_70._0_4_ = id_00;
              join<char_const(&)[2],unsigned_int,char_const(&)[2]>
                        ((string *)local_b8,(spirv_cross *)0x3464bc,(char (*) [2])local_70,
                         (uint *)0x33ea72,(char (*) [2])pbVar28);
              ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_b8._0_8_);
              puVar5 = local_b8;
              pTVar26 = (TypedID<(spirv_cross::Types)0> *)local_b8._0_8_;
LAB_001e9cfc:
              if (pTVar26 != (TypedID<(spirv_cross::Types)0> *)(puVar5 + 0x10)) {
                operator_delete(pTVar26);
              }
            }
            if ((((byte)local_7c | ~(byte)local_bc) & 1) == 0) {
              pSVar12 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_Compiler).ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   ((TypeID *)(local_f8._40_8_ + 0x114))->id);
              ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (this->super_Compiler)._vptr_Compiler;
              pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_10a;
              (*(code *)ts_3[0xb]._M_string_length)
                        (this,__return_storage_ptr__,pSVar12,local_f8._36_4_);
            }
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_f8._0_8_);
            local_10a = false;
            uVar29 = (ulong)((TypeID *)(local_f8._40_8_ + 0x114))->id;
            local_f8._40_8_ =
                 Variant::get<spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + uVar29);
            if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
              operator_delete((void *)local_f8._0_8_);
            }
            local_f8._36_4_ = 0;
            local_bc = 0;
          }
        }
        else {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          if ((uVar22 & 1) == 0) {
            to_unpacked_expression_abi_cxx11_
                      ((string *)local_f8,this,id_00,(local_109._13_4_ & 8) == 0);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_f8._0_8_);
          }
          else {
            cVar8 = '\x01';
            if (9 < id_00) {
              cVar6 = '\x04';
              do {
                cVar8 = cVar6;
                uVar20 = (uint)uVar23;
                if (uVar20 < 100) {
                  cVar8 = cVar8 + -2;
                  goto LAB_001e9b57;
                }
                if (uVar20 < 1000) {
                  cVar8 = cVar8 + -1;
                  goto LAB_001e9b57;
                }
                if (uVar20 < 10000) goto LAB_001e9b57;
                uVar23 = uVar23 / 10000;
                cVar6 = cVar8 + '\x04';
              } while (99999 < uVar20);
              cVar8 = cVar8 + '\x01';
            }
LAB_001e9b57:
            local_f8._0_8_ = local_f8 + 0x10;
            ::std::__cxx11::string::_M_construct((ulong)local_f8,cVar8);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_f8._0_8_,local_f8._8_4_,id_00);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_f8._0_8_);
          }
          if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
            operator_delete((void *)local_f8._0_8_);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar29 = (ulong)((TypeID *)(local_f8._40_8_ + 0x114))->id;
          local_f8._40_8_ =
               Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          uVar29);
        }
      }
      else {
        uVar20 = local_c0;
        if ((this->options).flatten_multidimensional_arrays == true) {
          bVar7 = *(size_t *)(local_f8._40_8_ + 0x28) != 0;
          unaff_R14 = (SPIRExpression *)CONCAT71(uVar30,bVar7);
          uVar20 = (uint)unaff_R14;
          local_88 = unaff_R14;
          if (bVar7) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            uVar9 = extraout_EDX;
          }
        }
        local_c0 = uVar20;
        type = (SPIRType *)local_f8._40_8_;
        if (((this->options).flatten_multidimensional_arrays == true) &&
           (((ulong)local_88 & 1) != 0)) {
          if ((uVar22 & 1) == 0) {
            to_enclosed_expression_abi_cxx11_
                      ((string *)local_f8,this,id_00,(local_109._13_4_ & 8) == 0);
            type = (SPIRType *)local_f8._40_8_;
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_f8._0_8_);
          }
          else {
            cVar8 = '\x01';
            if (9 < id_00) {
              cVar6 = '\x04';
              do {
                cVar8 = cVar6;
                uVar20 = (uint)uVar23;
                if (uVar20 < 100) {
                  cVar8 = cVar8 + -2;
                  goto LAB_001e9792;
                }
                if (uVar20 < 1000) {
                  cVar8 = cVar8 + -1;
                  goto LAB_001e9792;
                }
                if (uVar20 < 10000) goto LAB_001e9792;
                uVar23 = uVar23 / 10000;
                cVar6 = cVar8 + '\x04';
              } while (99999 < uVar20);
              cVar8 = cVar8 + '\x01';
            }
LAB_001e9792:
            local_f8._0_8_ = local_f8 + 0x10;
            ::std::__cxx11::string::_M_construct((ulong)local_f8,cVar8);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_f8._0_8_,local_f8._8_4_,id_00);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_f8._0_8_);
          }
          if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
            operator_delete((void *)local_f8._0_8_);
          }
          uVar9 = (uint32_t)(type->array).super_VectorView<unsigned_int>.buffer_size;
          while (uVar9 != 0) {
            uVar9 = uVar9 - 1;
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            unaff_R14 = (SPIRExpression *)local_b8;
            pCVar25 = this;
            to_array_size_abi_cxx11_((string *)unaff_R14,this,type,uVar9);
            enclose_expression((string *)local_f8,pCVar25,(string *)unaff_R14);
            ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_f8._0_8_);
            if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
              operator_delete((void *)local_f8._0_8_);
            }
            if ((TypedID<(spirv_cross::Types)0> *)local_b8._0_8_ !=
                (TypedID<(spirv_cross::Types)0> *)(local_b8 + 0x10)) {
              operator_delete((void *)local_b8._0_8_);
            }
          }
          if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
            local_c0 = 0;
          }
          else {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          if ((local_c0 & 1) == 0) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        else {
          uVar20 = local_78;
          if ((uVar22 & 1) != 0) {
            uVar20 = local_109._13_4_;
          }
          pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)uVar20;
          ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_109;
          access_chain_internal_append_index
                    (this,__return_storage_ptr__,uVar9,pSVar12,uVar20,(bool *)ts_3,id_00);
          (*(this->super_Compiler)._vptr_Compiler[0x2c])
                    (this,__return_storage_ptr__,local_f8._40_8_,(ulong)(uint)local_f8._36_4_);
        }
        if (*(int *)(local_f8._40_8_ + 0xc) == 0x15) {
          uVar29 = (ulong)((TypeID *)(local_f8._40_8_ + 0x114))->id;
          local_f8._40_8_ =
               Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          uVar29);
        }
LAB_001e9b35:
        local_109[0] = '\x01';
      }
      pTVar31 = (TypedID<(spirv_cross::Types)0> *)((long)&pTVar31->id + 1);
      uVar20 = local_c0;
    } while (pTVar31 != local_40);
  }
  if ((uVar20 & 1) != 0) {
    prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_f8._0_8_ = local_f8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,
               "Flattening of multidimensional arrays were enabled, but the access chain was terminated in the middle of a multidimensional array. This is not supported."
               ,"");
    ::std::runtime_error::runtime_error(prVar19,(string *)local_f8);
    *(undefined ***)prVar19 = &PTR__runtime_error_003d7e38;
    __cxa_throw(prVar19,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (meta != (AccessChainMeta *)0x0) {
    meta->need_transpose = (bool)((byte)local_bc & 1);
    meta->storage_is_packed = local_10a;
    meta->storage_is_invariant = (bool)((byte)local_98._M_allocated_capacity._4_4_ & 1);
    meta->storage_physical_type = local_f8._36_4_;
    meta->relaxed_precision = (bool)((byte)local_98._M_allocated_capacity._0_4_ & 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::access_chain_internal(uint32_t base, const uint32_t *indices, uint32_t count,
                                           AccessChainFlags flags, AccessChainMeta *meta)
{
	string expr;

	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool msb_is_id = (flags & ACCESS_CHAIN_LITERAL_MSB_FORCE_ID) != 0;
	bool chain_only = (flags & ACCESS_CHAIN_CHAIN_ONLY_BIT) != 0;
	bool ptr_chain = (flags & ACCESS_CHAIN_PTR_CHAIN_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;
	bool flatten_member_reference = (flags & ACCESS_CHAIN_FLATTEN_ALL_MEMBERS_BIT) != 0;

	if (!chain_only)
	{
		// We handle transpose explicitly, so don't resolve that here.
		auto *e = maybe_get<SPIRExpression>(base);
		bool old_transpose = e && e->need_transpose;
		if (e)
			e->need_transpose = false;
		expr = to_enclosed_expression(base, register_expression_read);
		if (e)
			e->need_transpose = old_transpose;
	}

	// Start traversing type hierarchy at the proper non-pointer types,
	// but keep type_id referencing the original pointer for use below.
	uint32_t type_id = expression_type_id(base);

	if (!backend.native_pointers)
	{
		if (ptr_chain)
			SPIRV_CROSS_THROW("Backend does not support native pointers and does not support OpPtrAccessChain.");

		// Wrapped buffer reference pointer types will need to poke into the internal "value" member before
		// continuing the access chain.
		if (should_dereference(base))
		{
			auto &type = get<SPIRType>(type_id);
			expr = dereference_expression(type, expr);
		}
	}

	const auto *type = &get_pointee_type(type_id);

	bool access_chain_is_arrayed = expr.find_first_of('[') != string::npos;
	bool row_major_matrix_needs_conversion = is_non_native_row_major_matrix(base);
	bool is_packed = has_extended_decoration(base, SPIRVCrossDecorationPhysicalTypePacked);
	uint32_t physical_type = get_extended_decoration(base, SPIRVCrossDecorationPhysicalTypeID);
	bool is_invariant = has_decoration(base, DecorationInvariant);
	bool relaxed_precision = has_decoration(base, DecorationRelaxedPrecision);
	bool pending_array_enclose = false;
	bool dimension_flatten = false;

	const auto append_index = [&](uint32_t index, bool is_literal, bool is_ptr_chain = false) {
		AccessChainFlags mod_flags = flags;
		if (!is_literal)
			mod_flags &= ~ACCESS_CHAIN_INDEX_IS_LITERAL_BIT;
		if (!is_ptr_chain)
			mod_flags &= ~ACCESS_CHAIN_PTR_CHAIN_BIT;
		access_chain_internal_append_index(expr, base, type, mod_flags, access_chain_is_arrayed, index);
		check_physical_type_cast(expr, type, physical_type);
	};

	for (uint32_t i = 0; i < count; i++)
	{
		uint32_t index = indices[i];

		bool is_literal = index_is_literal;
		if (is_literal && msb_is_id && (index >> 31u) != 0u)
		{
			is_literal = false;
			index &= 0x7fffffffu;
		}

		// Pointer chains
		if (ptr_chain && i == 0)
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays)
			{
				dimension_flatten = type->array.size() >= 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(type->array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(*type, j - 1));
				}

				if (type->array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			else
			{
				append_index(index, is_literal, true);
			}

			if (type->basetype == SPIRType::ControlPointArray)
			{
				type_id = type->parent_type;
				type = &get<SPIRType>(type_id);
			}

			access_chain_is_arrayed = true;
		}
		// Arrays
		else if (!type->array.empty())
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays && !pending_array_enclose)
			{
				dimension_flatten = type->array.size() > 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			assert(type->parent_type);

			auto *var = maybe_get<SPIRVariable>(base);
			if (backend.force_gl_in_out_block && i == 0 && var && is_builtin_variable(*var) &&
			    !has_decoration(type->self, DecorationBlock))
			{
				// This deals with scenarios for tesc/geom where arrays of gl_Position[] are declared.
				// Normally, these variables live in blocks when compiled from GLSL,
				// but HLSL seems to just emit straight arrays here.
				// We must pretend this access goes through gl_in/gl_out arrays
				// to be able to access certain builtins as arrays.
				// Similar concerns apply for mesh shaders where we have to redirect to gl_MeshVerticesEXT or MeshPrimitivesEXT.
				auto builtin = ir.meta[base].decoration.builtin_type;
				bool mesh_shader = get_execution_model() == ExecutionModelMeshEXT;

				switch (builtin)
				{
				// case BuiltInCullDistance: // These are already arrays, need to figure out rules for these in tess/geom.
				// case BuiltInClipDistance:
				case BuiltInPosition:
				case BuiltInPointSize:
					if (mesh_shader)
						expr = join("gl_MeshVerticesEXT[", to_expression(index, register_expression_read), "].", expr);
					else if (var->storage == StorageClassInput)
						expr = join("gl_in[", to_expression(index, register_expression_read), "].", expr);
					else if (var->storage == StorageClassOutput)
						expr = join("gl_out[", to_expression(index, register_expression_read), "].", expr);
					else
						append_index(index, is_literal);
					break;

				case BuiltInPrimitiveId:
				case BuiltInLayer:
				case BuiltInViewportIndex:
				case BuiltInCullPrimitiveEXT:
				case BuiltInPrimitiveShadingRateKHR:
					if (mesh_shader)
						expr = join("gl_MeshPrimitivesEXT[", to_expression(index, register_expression_read), "].", expr);
					else
						append_index(index, is_literal);
					break;

				default:
					append_index(index, is_literal);
					break;
				}
			}
			else if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				auto &parent_type = get<SPIRType>(type->parent_type);

				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(parent_type.array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(parent_type, j - 1));
				}

				if (parent_type.array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			// Some builtins are arrays in SPIR-V but not in other languages, e.g. gl_SampleMask[] is an array in SPIR-V but not in Metal.
			// By throwing away the index, we imply the index was 0, which it must be for gl_SampleMask.
			else if (!builtin_translates_to_nonarray(BuiltIn(get_decoration(base, DecorationBuiltIn))))
			{
				append_index(index, is_literal);
			}

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);

			access_chain_is_arrayed = true;
		}
		// For structs, the index refers to a constant, which indexes into the members, possibly through a redirection mapping.
		// We also check if this member is a builtin, since we then replace the entire expression with the builtin one.
		else if (type->basetype == SPIRType::Struct)
		{
			if (!is_literal)
				index = evaluate_constant_u32(index);

			if (index < uint32_t(type->member_type_index_redirection.size()))
				index = type->member_type_index_redirection[index];

			if (index >= type->member_types.size())
				SPIRV_CROSS_THROW("Member index is out of bounds!");

			BuiltIn builtin;
			if (is_member_builtin(*type, index, &builtin) && access_chain_needs_stage_io_builtin_translation(base))
			{
				if (access_chain_is_arrayed)
				{
					expr += ".";
					expr += builtin_to_glsl(builtin, type->storage);
				}
				else
					expr = builtin_to_glsl(builtin, type->storage);
			}
			else
			{
				// If the member has a qualified name, use it as the entire chain
				string qual_mbr_name = get_member_qualified_name(type_id, index);
				if (!qual_mbr_name.empty())
					expr = qual_mbr_name;
				else if (flatten_member_reference)
					expr += join("_", to_member_name(*type, index));
				else
					expr += to_member_reference(base, *type, index, ptr_chain);
			}

			if (has_member_decoration(type->self, index, DecorationInvariant))
				is_invariant = true;
			if (has_member_decoration(type->self, index, DecorationRelaxedPrecision))
				relaxed_precision = true;

			is_packed = member_is_packed_physical_type(*type, index);
			if (member_is_remapped_physical_type(*type, index))
				physical_type = get_extended_member_decoration(type->self, index, SPIRVCrossDecorationPhysicalTypeID);
			else
				physical_type = 0;

			row_major_matrix_needs_conversion = member_is_non_native_row_major_matrix(*type, index);
			type = &get<SPIRType>(type->member_types[index]);
		}
		// Matrix -> Vector
		else if (type->columns > 1)
		{
			// If we have a row-major matrix here, we need to defer any transpose in case this access chain
			// is used to store a column. We can resolve it right here and now if we access a scalar directly,
			// by flipping indexing order of the matrix.

			expr += "[";
			if (is_literal)
				expr += convert_to_string(index);
			else
				expr += to_unpacked_expression(index, register_expression_read);
			expr += "]";

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		// Vector -> Scalar
		else if (type->vecsize > 1)
		{
			string deferred_index;
			if (row_major_matrix_needs_conversion)
			{
				// Flip indexing order.
				auto column_index = expr.find_last_of('[');
				if (column_index != string::npos)
				{
					deferred_index = expr.substr(column_index);
					expr.resize(column_index);
				}
			}

			// Internally, access chain implementation can also be used on composites,
			// ignore scalar access workarounds in this case.
			StorageClass effective_storage = StorageClassGeneric;
			bool ignore_potential_sliced_writes = false;
			if ((flags & ACCESS_CHAIN_FORCE_COMPOSITE_BIT) == 0)
			{
				if (expression_type(base).pointer)
					effective_storage = get_expression_effective_storage_class(base);

				// Special consideration for control points.
				// Control points can only be written by InvocationID, so there is no need
				// to consider scalar access chains here.
				// Cleans up some cases where it's very painful to determine the accurate storage class
				// since blocks can be partially masked ...
				auto *var = maybe_get_backing_variable(base);
				if (var && var->storage == StorageClassOutput &&
				    get_execution_model() == ExecutionModelTessellationControl &&
				    !has_decoration(var->self, DecorationPatch))
				{
					ignore_potential_sliced_writes = true;
				}
			}
			else
				ignore_potential_sliced_writes = true;

			if (!row_major_matrix_needs_conversion && !ignore_potential_sliced_writes)
			{
				// On some backends, we might not be able to safely access individual scalars in a vector.
				// To work around this, we might have to cast the access chain reference to something which can,
				// like a pointer to scalar, which we can then index into.
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			if (is_literal)
			{
				bool out_of_bounds = (index >= type->vecsize);

				if (!is_packed && !row_major_matrix_needs_conversion)
				{
					expr += ".";
					expr += index_to_swizzle(out_of_bounds ? 0 : index);
				}
				else
				{
					// For packed vectors, we can only access them as an array, not by swizzle.
					expr += join("[", out_of_bounds ? 0 : index, "]");
				}
			}
			else if (ir.ids[index].get_type() == TypeConstant && !is_packed && !row_major_matrix_needs_conversion)
			{
				auto &c = get<SPIRConstant>(index);
				bool out_of_bounds = (c.scalar() >= type->vecsize);

				if (c.specialization)
				{
					// If the index is a spec constant, we cannot turn extract into a swizzle.
					expr += join("[", out_of_bounds ? "0" : to_expression(index), "]");
				}
				else
				{
					expr += ".";
					expr += index_to_swizzle(out_of_bounds ? 0 : c.scalar());
				}
			}
			else
			{
				expr += "[";
				expr += to_unpacked_expression(index, register_expression_read);
				expr += "]";
			}

			if (row_major_matrix_needs_conversion && !ignore_potential_sliced_writes)
			{
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			expr += deferred_index;
			row_major_matrix_needs_conversion = false;

			is_packed = false;
			physical_type = 0;
			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		else if (!backend.allow_truncated_access_chain)
			SPIRV_CROSS_THROW("Cannot subdivide a scalar value!");
	}

	if (pending_array_enclose)
	{
		SPIRV_CROSS_THROW("Flattening of multidimensional arrays were enabled, "
		                  "but the access chain was terminated in the middle of a multidimensional array. "
		                  "This is not supported.");
	}

	if (meta)
	{
		meta->need_transpose = row_major_matrix_needs_conversion;
		meta->storage_is_packed = is_packed;
		meta->storage_is_invariant = is_invariant;
		meta->storage_physical_type = physical_type;
		meta->relaxed_precision = relaxed_precision;
	}

	return expr;
}